

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decompression.cpp
# Opt level: O1

void debugDecompress(uint32_t offset,uint32_t size,istream *in,bool isSwitch)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  bool bVar3;
  uint uVar4;
  Size *pSVar5;
  long *plVar6;
  size_type *psVar7;
  long *plVar8;
  ulong uVar9;
  Size SVar10;
  uint uVar11;
  uint __val;
  ulong uVar12;
  vector<unsigned_char,_std::allocator<unsigned_char>_> output;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  string __str;
  ChunkHeader header;
  ofstream out;
  string_type local_388;
  Image local_368;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_348;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_328;
  long *local_310;
  long local_308;
  long local_300;
  long lStack_2f8;
  long *local_2f0 [2];
  long local_2e0 [2];
  path local_2d0;
  string local_2a8;
  long local_288;
  undefined8 local_280;
  ChunkHeader local_278;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_328,(ulong)size,(allocator_type *)&local_230);
  local_348.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_348.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_348.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::istream::seekg((long)in,offset);
  local_278.transparentMasks.super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_278.transparentMasks.super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_278.masks.super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_278.transparentMasks.super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_278.masks.super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_278.masks.super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  operator>>(in,&local_278);
  std::istream::seekg((long)in,offset);
  std::istream::read((char *)in,
                     (long)local_328.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start);
  uVar9 = (long)local_328.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_328.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (uVar9 != 0) {
    local_288 = _VTT;
    local_280 = _iconv_open;
    uVar12 = 0;
    do {
      __val = (uint)uVar12;
      bVar3 = decompressHigu(&local_348,
                             local_328.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start + uVar12,(int)uVar9 - __val,
                             isSwitch);
      if (bVar3) {
        uVar11 = 1;
        if (9 < uVar12) {
          uVar2 = 4;
          uVar9 = uVar12;
          do {
            uVar11 = uVar2;
            uVar4 = (uint)uVar9;
            if (uVar4 < 100) {
              uVar11 = uVar11 - 2;
              goto LAB_00107273;
            }
            if (uVar4 < 1000) {
              uVar11 = uVar11 - 1;
              goto LAB_00107273;
            }
            if (uVar4 < 10000) goto LAB_00107273;
            uVar9 = (uVar9 & 0xffffffff) / 10000;
            uVar2 = uVar11 + 4;
          } while (99999 < uVar4);
          uVar11 = uVar11 + 1;
        }
LAB_00107273:
        local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
        std::__cxx11::string::_M_construct((ulong)&local_388,(char)uVar11);
        std::__detail::__to_chars_10_impl<unsigned_int>(local_388._M_dataplus._M_p,uVar11,__val);
        pSVar5 = (Size *)std::__cxx11::string::replace((ulong)&local_388,0,(char *)0x0,0x116310);
        local_368.size =
             (Size)&local_368.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        SVar10 = (Size)(pSVar5 + 2);
        paVar1 = &local_2d0._M_pathname.field_2;
        if (*pSVar5 == SVar10) {
          local_368.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
          super__Vector_impl_data._M_finish = *(pointer *)SVar10;
          local_368.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = *(pointer *)(pSVar5 + 3);
        }
        else {
          local_368.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
          super__Vector_impl_data._M_finish = *(pointer *)SVar10;
          local_368.size = *pSVar5;
        }
        local_368.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
        super__Vector_impl_data._M_start = *(pointer *)(pSVar5 + 1);
        *pSVar5 = SVar10;
        pSVar5[1].width = 0;
        pSVar5[1].height = 0;
        *(undefined1 *)&pSVar5[2].width = 0;
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_368);
        psVar7 = (size_type *)(plVar6 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar7) {
          local_2d0._M_pathname.field_2._M_allocated_capacity = *psVar7;
          local_2d0._M_pathname.field_2._8_8_ = plVar6[3];
          local_2d0._M_pathname._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_2d0._M_pathname.field_2._M_allocated_capacity = *psVar7;
          local_2d0._M_pathname._M_dataplus._M_p = (pointer)*plVar6;
        }
        local_2d0._M_pathname._M_string_length = plVar6[1];
        *plVar6 = (long)psVar7;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        std::ofstream::ofstream(&local_230,(string *)&local_2d0,_S_bin);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2d0._M_pathname._M_dataplus._M_p != paVar1) {
          operator_delete(local_2d0._M_pathname._M_dataplus._M_p,
                          local_2d0._M_pathname.field_2._M_allocated_capacity + 1);
        }
        if (local_368.size !=
            (Size)&local_368.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
                   super__Vector_impl_data._M_finish) {
          operator_delete((void *)local_368.size,
                          (ulong)&(local_368.colorData.
                                   super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
                                   super__Vector_impl_data._M_finish)->g);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_388._M_dataplus._M_p != &local_388.field_2) {
          operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
        }
        std::ostream::write((char *)&local_230,
                            (long)local_348.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
        if ((ulong)((uint)local_278.h * (uint)local_278.w + 0x400) <=
            (ulong)((long)local_348.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)local_348.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_start)) {
          SVar10.height._2_2_ = 0;
          SVar10._0_6_ = CONCAT24(local_278.h,local_278.w + 3) & 0xfffffffffffc;
          local_368.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_368.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_368.size.width = 0;
          local_368.size.height = 0;
          local_368.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          getIndexed(&local_368,&local_348,SVar10,isSwitch,0x100);
          uVar11 = 1;
          if (9 < uVar12) {
            uVar2 = 4;
            uVar9 = uVar12;
            do {
              uVar11 = uVar2;
              uVar4 = (uint)uVar9;
              if (uVar4 < 100) {
                uVar11 = uVar11 - 2;
                goto LAB_0010748a;
              }
              if (uVar4 < 1000) {
                uVar11 = uVar11 - 1;
                goto LAB_0010748a;
              }
              if (uVar4 < 10000) goto LAB_0010748a;
              uVar9 = (uVar9 & 0xffffffff) / 10000;
              uVar2 = uVar11 + 4;
            } while (99999 < uVar4);
            uVar11 = uVar11 + 1;
          }
LAB_0010748a:
          local_2f0[0] = local_2e0;
          std::__cxx11::string::_M_construct((ulong)local_2f0,(char)uVar11);
          std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_2f0[0],uVar11,__val);
          plVar6 = (long *)std::__cxx11::string::replace((ulong)local_2f0,0,(char *)0x0,0x116310);
          local_310 = &local_300;
          plVar8 = plVar6 + 2;
          if ((long *)*plVar6 == plVar8) {
            local_300 = *plVar8;
            lStack_2f8 = plVar6[3];
          }
          else {
            local_300 = *plVar8;
            local_310 = (long *)*plVar6;
          }
          local_308 = plVar6[1];
          *plVar6 = (long)plVar8;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          plVar6 = (long *)std::__cxx11::string::append((char *)&local_310);
          local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
          psVar7 = (size_type *)(plVar6 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar6 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar7) {
            local_388.field_2._M_allocated_capacity = *psVar7;
            local_388.field_2._8_8_ = plVar6[3];
          }
          else {
            local_388.field_2._M_allocated_capacity = *psVar7;
            local_388._M_dataplus._M_p = (pointer)*plVar6;
          }
          local_388._M_string_length = plVar6[1];
          *plVar6 = (long)psVar7;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          std::filesystem::__cxx11::path::path(&local_2d0,&local_388,auto_format);
          local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"");
          Image::writePNG(&local_368,&local_2d0,&local_2a8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
            operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
          }
          std::filesystem::__cxx11::path::~path(&local_2d0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_388._M_dataplus._M_p != &local_388.field_2) {
            operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
          }
          if (local_310 != &local_300) {
            operator_delete(local_310,local_300 + 1);
          }
          if (local_2f0[0] != local_2e0) {
            operator_delete(local_2f0[0],local_2e0[0] + 1);
          }
          if ((Size)local_368.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
                    super__Vector_impl_data._M_start != (Size)0x0) {
            operator_delete(local_368.colorData.super__Vector_base<Color,_std::allocator<Color>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_368.colorData.
                                  super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)local_368.colorData.
                                  super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
        }
        local_230 = local_288;
        *(undefined8 *)(local_228 + *(long *)(local_288 + -0x18) + -8) = local_280;
        std::filebuf::~filebuf(local_228);
        std::ios_base::~ios_base(local_138);
      }
      uVar12 = uVar12 + 1;
      uVar9 = (long)local_328.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)local_328.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start;
    } while (uVar12 < uVar9);
  }
  if (local_278.transparentMasks.super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.transparentMasks.
                    super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_278.transparentMasks.
                          super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.transparentMasks.
                          super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_278.masks.super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.masks.super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_278.masks.super__Vector_base<MaskRect,_std::allocator<MaskRect>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.masks.super__Vector_base<MaskRect,_std::allocator<MaskRect>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_348.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_348.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_348.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_348.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_328.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_328.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_328.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_328.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void debugDecompress(uint32_t offset, uint32_t size, std::istream &in, bool isSwitch) {
	std::vector<uint8_t> data(size);
	std::vector<uint8_t> output;
	in.seekg(offset, in.beg);
	ChunkHeader header;
	in >> header;
	in.seekg(offset, in.beg);
	in.read((char *)data.data(), data.size());

	for (int i = 0; i < data.size(); i++) {
		if (decompressHigu(output, data.data() + i, (int)data.size() - i, isSwitch)) {
			std::ofstream out("/tmp/chunks/data" + std::to_string(i) + ".dat", std::ios::binary);
			out.write((char *)output.data(), output.size());
			if (output.size() >= 1024 + header.w * header.h) {
				Image img({0, 0});
				getIndexed(img, output, align({header.w, header.h}), isSwitch);
				img.writePNG("/tmp/chunks/data" + std::to_string(i) + ".png");
			}
		}
	}
}